

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::setSolution(Highs *this,HighsSolution *solution)

{
  HighsStatus HVar1;
  size_type sVar2;
  size_type sVar3;
  long in_RSI;
  long in_RDI;
  bool new_solution;
  bool new_dual_solution;
  bool new_primal_solution;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Highs *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe90;
  long in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  HighsStatus in_stack_fffffffffffffea4;
  bool local_14a;
  bool local_149;
  bool local_13a;
  allocator local_139;
  string local_138 [32];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  HighsSolution *in_stack_fffffffffffffef0;
  HighsLp *in_stack_fffffffffffffef8;
  HighsSparseMatrix *in_stack_ffffffffffffff20;
  allocator local_b1;
  string local_b0 [145];
  bool local_1f;
  bool local_1e;
  bool local_1d;
  HighsStatus local_1c;
  long local_18;
  
  local_1c = kOk;
  local_13a = false;
  local_18 = in_RSI;
  if (0 < *(int *)(in_RDI + 0x138)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 8));
    local_13a = (ulong)(long)*(int *)(in_RDI + 0x138) <= sVar2;
  }
  local_1d = local_13a;
  local_149 = false;
  if (0 < *(int *)(in_RDI + 0x13c)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50));
    local_149 = (ulong)(long)*(int *)(in_RDI + 0x13c) <= sVar2;
  }
  local_1e = local_149;
  local_14a = true;
  if ((local_1d & 1U) == 0) {
    local_14a = local_149;
  }
  local_1f = local_14a;
  if (local_14a == false) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(local_18 + 8));
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50));
    in_stack_fffffffffffffe48 = *(undefined4 *)(in_RDI + 0x13c);
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "setSolution: User solution is rejected due to mismatch between size of col_value and row_dual vectors (%d, %d) and number of columns and rows in the model (%d, %d)\n"
                 ,sVar2 & 0xffffffff,sVar3 & 0xffffffff,(ulong)*(uint *)(in_RDI + 0x138));
    local_1c = kError;
  }
  else {
    invalidateSolverData(in_stack_fffffffffffffe50);
  }
  if ((local_1d & 1U) != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
    if (0 < *(int *)(in_RDI + 0x13c)) {
      in_stack_fffffffffffffe98 = in_RDI + 8;
      in_stack_fffffffffffffe90 = (string *)(in_RDI + 0x138);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      HighsSparseMatrix::ensureColwise(in_stack_ffffffffffffff20);
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)in_stack_fffffffffffffe50,
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      in_stack_fffffffffffffea4 =
           calculateRowValuesQuad
                     ((HighsLp *)in_stack_fffffffffffffe50,
                      (HighsSolution *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                      ,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"calculateRowValuesQuad",&local_b1);
      local_1c = interpretCallStatus((HighsLogOptions *)
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     (HighsStatus)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                                     (HighsStatus)in_stack_fffffffffffffe98,
                                     in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x490bc8);
      if (local_1c == kError) {
        return kError;
      }
    }
    *(undefined1 *)(in_RDI + 8) = 1;
  }
  if ((local_1e & 1U) != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
    if (0 < *(int *)(in_RDI + 0x138)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),in_RDI + 0x138);
      HighsSparseMatrix::ensureColwise(in_stack_ffffffffffffff20);
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)in_stack_fffffffffffffe50,
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      calculateColDualsQuad(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"calculateColDuals",&local_139);
      local_1c = interpretCallStatus((HighsLogOptions *)
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     (HighsStatus)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                                     (HighsStatus)in_stack_fffffffffffffe98,
                                     in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x490d93);
      if (local_1c == kError) {
        return kError;
      }
    }
    *(undefined1 *)(in_RDI + 9) = 1;
  }
  HVar1 = returnFromHighs((Highs *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          (HighsStatus)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  return HVar1;
}

Assistant:

HighsStatus Highs::setSolution(const HighsSolution& solution) {
  HighsStatus return_status = HighsStatus::kOk;
  // Determine whether a new solution will be defined. If so,
  // the old solution and any basis are cleared
  const bool new_primal_solution =
      model_.lp_.num_col_ > 0 &&
      solution.col_value.size() >= static_cast<size_t>(model_.lp_.num_col_);
  const bool new_dual_solution =
      model_.lp_.num_row_ > 0 &&
      solution.row_dual.size() >= static_cast<size_t>(model_.lp_.num_row_);
  const bool new_solution = new_primal_solution || new_dual_solution;

  if (new_solution) {
    invalidateSolverData();
  } else {
    // Solution is rejected, so give a logging message and error
    // return
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "setSolution: User solution is rejected due to mismatch between "
        "size of col_value and row_dual vectors (%d, %d) and number "
        "of columns and rows in the model (%d, %d)\n",
        int(solution.col_value.size()), int(solution.row_dual.size()),
        int(model_.lp_.num_col_), int(model_.lp_.num_row_));
    return_status = HighsStatus::kError;
  }

  if (new_primal_solution) {
    solution_.col_value = solution.col_value;
    if (model_.lp_.num_row_ > 0) {
      // Worth computing the row values
      solution_.row_value.resize(model_.lp_.num_row_);
      // Matrix must be column-wise
      model_.lp_.a_matrix_.ensureColwise();
      return_status = interpretCallStatus(
          options_.log_options, calculateRowValuesQuad(model_.lp_, solution_),
          return_status, "calculateRowValuesQuad");
      if (return_status == HighsStatus::kError) return return_status;
    }
    solution_.value_valid = true;
  }
  if (new_dual_solution) {
    solution_.row_dual = solution.row_dual;
    if (model_.lp_.num_col_ > 0) {
      // Worth computing the column duals
      solution_.col_dual.resize(model_.lp_.num_col_);
      // Matrix must be column-wise
      model_.lp_.a_matrix_.ensureColwise();
      return_status = interpretCallStatus(
          options_.log_options, calculateColDualsQuad(model_.lp_, solution_),
          return_status, "calculateColDuals");
      if (return_status == HighsStatus::kError) return return_status;
    }
    solution_.dual_valid = true;
  }
  return returnFromHighs(return_status);
}